

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::cleanSpaces(string *unit_string,bool skipMultiply)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 *puVar6;
  long lVar7;
  difference_type dVar8;
  long lVar9;
  size_type f2;
  size_type notspace;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  char *local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  char *local_f8;
  undefined8 local_f0;
  ulong local_e8;
  size_type oloc;
  size_type nloc;
  size_type fnd;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  byte local_55;
  bool spacesRemoved;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  byte local_19;
  string *psStack_18;
  bool skipMultiply_local;
  string *unit_string_local;
  
  local_19 = skipMultiply;
  psStack_18 = unit_string;
  if ((cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_),
     iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40," \t\n\r",&local_41);
    std::operator+(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&local_40,'\0');
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    __cxa_atexit(std::__cxx11::string::~string,
                 &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
  }
  psVar1 = psStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"square ",&local_79);
  bVar2 = isolatePriorModifier(psVar1,&local_78,'d','D');
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  psVar1 = psStack_18;
  local_55 = bVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"cubic ",&local_a1);
  bVar2 = isolatePriorModifier(psVar1,&local_a0,'_','-');
  local_55 = local_55 & 1 | bVar2;
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  psVar1 = psStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8," squared",(allocator *)((long)&fnd + 7));
  bVar2 = isolatePostModifier(psVar1,&local_c8);
  local_55 = (local_55 & 1) != 0 || bVar2;
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fnd + 7));
  nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
LAB_001be47c:
  if (nloc == 0xffffffffffffffff) {
    return (bool)(local_55 & 1);
  }
  local_55 = 1;
  if ((nloc != 0) && ((local_19 & 1) == 0)) {
    oloc = std::__cxx11::string::find_first_not_of((string *)psStack_18,0x257e78);
    if (oloc == 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)psStack_18,nloc);
      return true;
    }
    if (nloc == 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
      bVar2 = isOperator(*pcVar4);
      if (((bVar2) ||
          (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), *pcVar4 == '^')) ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), *pcVar4 == '@')) {
        std::__cxx11::string::erase((ulong)psStack_18,nloc);
        nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
      }
      else {
        uVar5 = std::__cxx11::string::size();
        if (uVar5 < 8) {
          puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)psStack_18);
          *puVar6 = 0x2a;
          nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
          local_19 = 1;
        }
        else {
          lVar7 = std::__cxx11::string::find_first_of((char)psStack_18,0x2a);
          if ((lVar7 != -1) ||
             (local_e8 = std::__cxx11::string::find_first_of((char *)psStack_18,0x1e77ed),
             8 < local_e8)) goto LAB_001be727;
          puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)psStack_18);
          *puVar6 = 0x2a;
          nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
          local_19 = 1;
        }
      }
      goto LAB_001be47c;
    }
LAB_001be727:
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    bVar2 = isOperator(*pcVar4);
    if (bVar2) {
      std::__cxx11::string::erase((ulong)psStack_18,nloc);
      nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
      goto LAB_001be47c;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    if (*pcVar4 == '.') {
      nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
      goto LAB_001be47c;
    }
    uVar5 = std::__cxx11::string::size();
    if (oloc < uVar5) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
      bVar2 = isOperator(*pcVar4);
      if (bVar2) {
        std::__cxx11::string::erase((ulong)psStack_18,nloc);
        nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
        goto LAB_001be47c;
      }
    }
    local_f0 = std::__cxx11::string::begin();
    local_100._M_current = (char *)std::__cxx11::string::begin();
    local_f8 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_100,nloc);
    bVar2 = std::
            all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,units::cleanSpaces(std::__cxx11::string&,bool)::__0>
                      (local_f0,local_f8);
    if (bVar2) {
      puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)psStack_18);
      *puVar6 = 0x2a;
      nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
      local_19 = 1;
      goto LAB_001be47c;
    }
    local_110._M_current = (char *)std::__cxx11::string::begin();
    local_120._M_current = (char *)std::__cxx11::string::begin();
    local_118 = (char *)__gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+(&local_120,nloc);
    notspace._7_1_ = 0x2f;
    dVar8 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      (local_110,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_118,(char *)((long)&notspace + 7));
    if (((dVar8 == 1) &&
        (lVar7 = std::__cxx11::string::rfind((char *)psStack_18,0x1e7c53), lVar7 == -1)) &&
       (lVar7 = std::__cxx11::string::rfind((char *)psStack_18,0x1e7c57), lVar7 == -1)) {
      lVar7 = std::__cxx11::string::find_first_not_of((string *)psStack_18,0x257e78);
      lVar9 = std::__cxx11::string::find_first_of((char *)psStack_18,0x1e7c5b);
      if ((lVar7 != -1) && (lVar9 != lVar7)) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
        bVar2 = isDigitCharacter(*pcVar4);
        if (bVar2) goto LAB_001bea16;
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)psStack_18);
        *puVar6 = 0x2a;
        local_19 = 1;
        nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
        goto LAB_001be47c;
      }
    }
  }
LAB_001bea16:
  if ((nloc == 0) ||
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), *pcVar4 != '.')) {
    std::__cxx11::string::erase((ulong)psStack_18,nloc);
    if (nloc != 0) {
      local_19 = 1;
    }
  }
  else {
    nloc = nloc + 1;
  }
  nloc = std::__cxx11::string::find_first_of((string *)psStack_18,0x257e78);
  goto LAB_001be47c;
}

Assistant:

static bool cleanSpaces(std::string& unit_string, bool skipMultiply)
{
    static const std::string spaceChars = std::string(" \t\n\r") + '\0';

    bool spacesRemoved = isolatePriorModifier(unit_string, "square ", 'd', 'D');
    spacesRemoved |= isolatePriorModifier(unit_string, "cubic ", '_', '-');
    spacesRemoved |= isolatePostModifier(unit_string, " squared");
    auto fnd = unit_string.find_first_of(spaceChars);
    while (fnd != std::string::npos) {
        spacesRemoved = true;
        if ((fnd > 0) && (!skipMultiply)) {
            auto nloc = unit_string.find_first_not_of(spaceChars, fnd);
            if (nloc == std::string::npos) {
                unit_string.erase(fnd);
                return true;
            }
            if (fnd == 1) {  // if the second character is a space it almost
                             // always means multiply
                if (isOperator(unit_string[nloc]) || unit_string[nloc] == '^' ||
                    unit_string[nloc] == '@') {
                    unit_string.erase(fnd, 1);
                    fnd = unit_string.find_first_of(spaceChars, fnd);
                    continue;
                }

                if (unit_string.size() < 8) {
                    unit_string[fnd] = '*';
                    fnd = unit_string.find_first_of(spaceChars, fnd);
                    skipMultiply = true;
                    continue;
                }
                if (unit_string.find_first_of('*') == std::string::npos) {
                    auto oloc = unit_string.find_first_of("/^", nloc);
                    if (oloc < 9) {
                        unit_string[fnd] = '*';
                        fnd = unit_string.find_first_of(spaceChars, fnd);
                        skipMultiply = true;
                        continue;
                    }
                }
            }
            if (isOperator(unit_string[fnd - 1])) {
                unit_string.erase(fnd, 1);
                fnd = unit_string.find_first_of(spaceChars, fnd);
                continue;
            }
            if (unit_string[fnd - 1] == '.') {
                // this is an abbreviation so deal with it later
                fnd = unit_string.find_first_of(spaceChars, fnd + 1);
                continue;
            }
            if (unit_string.size() > nloc && isOperator(unit_string[nloc])) {
                unit_string.erase(fnd, 1);
                fnd = unit_string.find_first_of(spaceChars, fnd);
                continue;
            }
            if (std::all_of(
                    unit_string.begin(), unit_string.begin() + fnd, [](char X) {
                        return isNumericalStartCharacter(X) || isOperator(X);
                    })) {
                unit_string[fnd] = '*';
                fnd = unit_string.find_first_of(spaceChars, fnd);
                skipMultiply = true;
                continue;
            }
            // if there was a single divide with no space then the next space is
            // probably a multiply
            if (std::count(
                    unit_string.begin(), unit_string.begin() + fnd, '/') == 1) {
                if (unit_string.rfind("/sq", fnd) == std::string::npos &&
                    unit_string.rfind("/cu", fnd) == std::string::npos) {
                    auto notspace =
                        unit_string.find_first_not_of(spaceChars, fnd);
                    auto f2 =
                        unit_string.find_first_of("*/^([{\xB7\xFA\xD7", fnd);
                    if (notspace != std::string::npos && f2 != notspace &&
                        !isDigitCharacter(unit_string[fnd - 1])) {
                        unit_string[fnd] = '*';

                        skipMultiply = true;
                        fnd = unit_string.find_first_of(spaceChars, fnd);
                        continue;
                    }
                }
            }
        }
        if (fnd > 0 && unit_string[fnd - 1] == '.') {
            // this now gets dealt with in the dotMultiply code
            ++fnd;
        } else {
            unit_string.erase(fnd, 1);
            if (fnd > 0) {
                skipMultiply = true;
            }
        }

        fnd = unit_string.find_first_of(spaceChars, fnd);
    }
    return spacesRemoved;
}